

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop_extension.c
# Opt level: O1

void prf_pop_extension_exit_f(prf_node_t *node,prf_state_t *state)

{
  if (node->opcode == prf_pop_extension_info.opcode) {
    state->extension_level = state->extension_level - 1;
    return;
  }
  prf_error(9,"tried pop extension exit state method on node of type %d.");
  return;
}

Assistant:

static
void
prf_pop_extension_exit_f(
    prf_node_t * node,
    prf_state_t * state )
{
    assert( node != NULL && state != NULL );
    if ( node->opcode != prf_pop_extension_info.opcode ) {
        prf_error( 9,
            "tried pop extension exit state method on node of type %d.",
            node->opcode );
        return;
    }
    state->extension_level--;
}